

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void udp_pipe_recv(void *arg,nni_aio *aio)

{
  long lVar1;
  _Bool _Var2;
  nni_mtx *mtx;
  
  lVar1 = *arg;
  nni_aio_reset(aio);
  mtx = (nni_mtx *)(lVar1 + 8);
  nni_mtx_lock(mtx);
  if (*(char *)((long)arg + 0xb0) == '\x01') {
    nni_mtx_unlock(mtx);
    nni_aio_finish_error(aio,NNG_ECLOSED);
    return;
  }
  _Var2 = nni_aio_start(aio,udp_pipe_recv_cancel,arg);
  if (_Var2) {
    nni_list_append((nni_list *)((long)arg + 0x128),aio);
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
udp_pipe_recv(void *arg, nni_aio *aio)
{
	udp_pipe *p  = arg;
	udp_ep   *ep = p->ep;

	nni_aio_reset(aio);
	nni_mtx_lock(&ep->mtx);
	if (p->closed) {
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if (!nni_aio_start(aio, udp_pipe_recv_cancel, p)) {
		nni_mtx_unlock(&ep->mtx);
		return;
	}

	nni_list_append(&p->rx_aios, aio);
	nni_mtx_unlock(&ep->mtx);
}